

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O1

void UdpServerReadCallback(sz_sock sockfd,Timestamp receiveTime)

{
  sz_ssize_t sVar1;
  size_t sVar2;
  int iVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_1458;
  char local_488 [8];
  char message [1024];
  char addrStr [64];
  sockaddr peerAddr;
  
  addrStr[0x38] = '\0';
  addrStr[0x39] = '\0';
  addrStr[0x3a] = '\0';
  addrStr[0x3b] = '\0';
  addrStr[0x3c] = '\0';
  addrStr[0x3d] = '\0';
  addrStr[0x3e] = '\0';
  addrStr[0x3f] = '\0';
  sVar1 = sznet::net::sockets::sz_udp_recv(sockfd,local_488,0x400,(sockaddr *)(addrStr + 0x38));
  if (sVar1 < 0) {
    file_01._8_8_ = 0x13;
    file_01.m_data = "udp_echo_server.cpp";
    sznet::Logger::Logger(&local_1458,file_01,0x2d,false);
    if (0xb < (uint)(((int)&local_1458 + 0xfb0) - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1458.m_impl.m_stream.m_buffer.m_cur,"sz_udp_recv",0xb);
      local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + 0xb;
    }
  }
  else {
    sznet::net::sockets::sz_toipport(message + 0x3f8,0x40,(sockaddr *)(addrStr + 0x38));
    local_488[sVar1] = '\0';
    if (sznet::g_logLevel < 3) {
      file._8_8_ = 0x13;
      file.m_data = "udp_echo_server.cpp";
      sznet::Logger::Logger(&local_1458,file,0x34);
      iVar3 = (int)&local_1458 + 0xfb0;
      if (6 < (uint)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_1458.m_impl.m_stream.m_buffer.m_cur,"recv: ",6);
        local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + 6;
      }
      sVar2 = strlen(local_488);
      if (sVar2 < (ulong)(long)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
        memcpy(local_1458.m_impl.m_stream.m_buffer.m_cur,local_488,sVar2);
        local_1458.m_impl.m_stream.m_buffer.m_cur =
             local_1458.m_impl.m_stream.m_buffer.m_cur + sVar2;
      }
      if (8 < (uint)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_1458.m_impl.m_stream.m_buffer.m_cur,", from: ",8);
        local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + 8;
      }
      sVar2 = strlen(message + 0x3f8);
      if (sVar2 < (ulong)(long)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
        memcpy(local_1458.m_impl.m_stream.m_buffer.m_cur,message + 0x3f8,sVar2);
        local_1458.m_impl.m_stream.m_buffer.m_cur =
             local_1458.m_impl.m_stream.m_buffer.m_cur + sVar2;
      }
      sznet::Logger::~Logger(&local_1458);
    }
    sznet::net::sockets::sz_udp_send(sockfd,local_488,(int)sVar1,(sockaddr *)(addrStr + 0x38));
    if (2 < sznet::g_logLevel) {
      return;
    }
    file_00._8_8_ = 0x13;
    file_00.m_data = "udp_echo_server.cpp";
    sznet::Logger::Logger(&local_1458,file_00,0x39);
    iVar3 = (int)&local_1458 + 0xfb0;
    if (0xb < (uint)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1458.m_impl.m_stream.m_buffer.m_cur,"echo send: ",0xb);
      local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + 0xb;
    }
    sVar2 = strlen(local_488);
    if (sVar2 < (ulong)(long)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1458.m_impl.m_stream.m_buffer.m_cur,local_488,sVar2);
      local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + sVar2;
    }
    if (6 < (uint)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1458.m_impl.m_stream.m_buffer.m_cur,", to: ",6);
      local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + 6;
    }
    sVar2 = strlen(message + 0x3f8);
    if (sVar2 < (ulong)(long)(iVar3 - (int)local_1458.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1458.m_impl.m_stream.m_buffer.m_cur,message + 0x3f8,sVar2);
      local_1458.m_impl.m_stream.m_buffer.m_cur = local_1458.m_impl.m_stream.m_buffer.m_cur + sVar2;
    }
  }
  sznet::Logger::~Logger(&local_1458);
  return;
}

Assistant:

void UdpServerReadCallback(sockets::sz_sock sockfd, sznet::Timestamp receiveTime)
{
    char message[1024];
    void* recvBuf = reinterpret_cast<void*>(&message);
    struct sockaddr peerAddr;
    memset(&peerAddr, 0, sizeof(peerAddr));
    
    sz_ssize_t nr = sockets::sz_udp_recv(sockfd, recvBuf, 1024, &peerAddr);
    if (nr < 0)
    {
        LOG_SYSERR << "sz_udp_recv";
        return;
    }

    char addrStr[64];
    sockets::sz_toipport(addrStr, sizeof(addrStr), &peerAddr);
    message[nr] = 0;
    LOG_INFO << "recv: " << message << ", from: " << addrStr;

    const void* sendBuf = const_cast<const void*>(recvBuf);
    int sendBufSize = static_cast<int>(nr);
    nr = sockets::sz_udp_send(sockfd, sendBuf, sendBufSize, &peerAddr);
    LOG_INFO << "echo send: " << message << ", to: " << addrStr;
}